

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

btCollisionShape * __thiscall
btCollisionWorldImporter::convertCollisionShape
          (btCollisionWorldImporter *this,btCollisionShapeData *shapeData)

{
  float fVar1;
  uint uVar2;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined8 uVar3;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *plVar11;
  btOptimizedBvh **ppbVar12;
  btOptimizedBvh *pbVar13;
  undefined4 extraout_var_06;
  btCollisionShape *pbVar14;
  _func_int **pp_Var15;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  btStaticPlaneShapeData *planeData;
  long lVar16;
  btAlignedObjectArray<btVector3> *this_00;
  char *pcVar17;
  btCapsuleShape *cap;
  ulong uVar18;
  btConvexHullShape *pbVar19;
  int i;
  long lVar20;
  ulong uVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  btVector3 implicitShapeDimensions;
  btAlignedObjectArray<float> radii;
  btAlignedObjectArray<btVector3> tmpPoints;
  btVector3 localScaling;
  btVector3 local_40;
  undefined3 uVar6;
  undefined2 uVar8;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  
  iVar10 = shapeData->m_shapeType;
  pbVar19 = (btConvexHullShape *)0x0;
  switch(iVar10) {
  case 4:
  case 8:
  case 9:
  case 0xb:
  case 0xd:
switchD_0013dbb7_caseD_4:
    btVector3::deSerializeFloat(&implicitShapeDimensions,(btVector3FloatData *)(shapeData + 2));
    btVector3::deSerializeFloat(&localScaling,(btVector3FloatData *)(shapeData + 1));
    if (0xd < (uint)shapeData->m_shapeType) {
switchD_0013dbfb_caseD_1:
      printf("error: cannot create shape type (%d)\n");
      return (btCollisionShape *)(btConvexHullShape *)0x0;
    }
    fVar1 = *(float *)&shapeData[3].m_name;
    switch(shapeData->m_shapeType) {
    case 0:
      auVar23._4_4_ = implicitShapeDimensions.m_floats[1];
      auVar23._0_4_ = implicitShapeDimensions.m_floats[0];
      auVar23._8_8_ = 0;
      auVar24._8_8_ = 0;
      auVar24._0_4_ = localScaling.m_floats[0];
      auVar24._4_4_ = localScaling.m_floats[1];
      auVar24 = divps(auVar23,auVar24);
      tmpPoints.m_size = (int)(fVar1 + auVar24._4_4_);
      tmpPoints._0_4_ = fVar1 + auVar24._0_4_;
      tmpPoints.m_capacity =
           (int)(implicitShapeDimensions.m_floats[2] / localScaling.m_floats[2] + fVar1);
      tmpPoints._12_4_ = 0;
      iVar10 = (*this->_vptr_btCollisionWorldImporter[5])(this);
      pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var,iVar10);
      break;
    default:
      goto switchD_0013dbfb_caseD_1;
    case 4:
      uVar2 = shapeData[4].m_shapeType;
      tmpPoints.m_ownsMemory = true;
      tmpPoints.m_data = (btVector3 *)0x0;
      tmpPoints.m_size = 0;
      tmpPoints.m_capacity = 0;
      btAlignedObjectArray<btVector3>::resize(&tmpPoints,uVar2,(btVector3 *)&radii);
      uVar21 = 0;
      uVar18 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar18 = uVar21;
      }
      for (lVar16 = 0; uVar18 << 5 != lVar16; lVar16 = lVar16 + 0x20) {
        if (*(long *)&shapeData[3].m_shapeType != 0) {
          btVector3::deSerialize
                    ((btVector3 *)((long)(tmpPoints.m_data)->m_floats + uVar21),
                     (btVector3FloatData *)(*(long *)&shapeData[3].m_shapeType + uVar21));
        }
        if (shapeData[4].m_name != (char *)0x0) {
          btVector3::deSerializeDouble
                    ((btVector3 *)((long)(tmpPoints.m_data)->m_floats + uVar21),
                     (btVector3DoubleData *)(shapeData[4].m_name + lVar16));
        }
        uVar21 = uVar21 + 0x10;
      }
      pbVar19 = (btConvexHullShape *)(*this->_vptr_btCollisionWorldImporter[0x14])(this);
      for (lVar16 = 0; uVar18 * 0x10 != lVar16; lVar16 = lVar16 + 0x10) {
        btConvexHullShape::addPoint
                  (pbVar19,(btVector3 *)((long)(tmpPoints.m_data)->m_floats + lVar16),true);
      }
      (*(pbVar19->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
        super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
        _vptr_btCollisionShape[0xb])(*(undefined4 *)&shapeData[3].m_name,pbVar19);
      btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&tmpPoints);
      goto LAB_0013e0c1;
    case 8:
      pbVar19 = (btConvexHullShape *)
                (*this->_vptr_btCollisionWorldImporter[6])(implicitShapeDimensions.m_floats[0],this)
      ;
      break;
    case 9:
      uVar2 = *(uint *)&shapeData[4].m_name;
      tmpPoints.m_ownsMemory = true;
      tmpPoints.m_data = (btVector3 *)0x0;
      tmpPoints.m_size = 0;
      tmpPoints.m_capacity = 0;
      radii.m_ownsMemory = true;
      radii.m_data = (float *)0x0;
      radii.m_size = 0;
      radii.m_capacity = 0;
      local_40.m_floats[0] = 0.0;
      btAlignedObjectArray<float>::resize(&radii,uVar2,local_40.m_floats);
      btAlignedObjectArray<btVector3>::resize(&tmpPoints,uVar2,&local_40);
      lVar16 = 0;
      uVar18 = 0;
      if (0 < (int)uVar2) {
        uVar18 = (ulong)uVar2;
      }
      lVar20 = 0;
      for (uVar21 = 0; uVar18 != uVar21; uVar21 = uVar21 + 1) {
        btVector3::deSerializeFloat
                  ((btVector3 *)((long)(tmpPoints.m_data)->m_floats + lVar20),
                   (btVector3FloatData *)(*(long *)&shapeData[3].m_shapeType + lVar16));
        radii.m_data[uVar21] = *(float *)(*(long *)&shapeData[3].m_shapeType + 0x10 + lVar16);
        lVar20 = lVar20 + 0x10;
        lVar16 = lVar16 + 0x14;
      }
      pbVar19 = (btConvexHullShape *)
                (*this->_vptr_btCollisionWorldImporter[0x17])
                          (this,tmpPoints.m_data,radii.m_data,uVar2);
      btAlignedObjectArray<float>::~btAlignedObjectArray(&radii);
      btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&tmpPoints);
      break;
    case 0xb:
      iVar10 = shapeData[3].m_shapeType;
      if (iVar10 == 2) {
        pbVar19 = (btConvexHullShape *)
                  (*this->_vptr_btCollisionWorldImporter[0xf])
                            (implicitShapeDimensions.m_floats[0],implicitShapeDimensions.m_floats[2]
                             ,this);
      }
      else if (iVar10 == 1) {
        pbVar19 = (btConvexHullShape *)
                  (*this->_vptr_btCollisionWorldImporter[0xe])
                            (implicitShapeDimensions.m_floats[0],implicitShapeDimensions.m_floats[1]
                             ,this);
      }
      else {
        if (iVar10 != 0) {
          pcVar17 = "unknown Cone up axis";
          goto LAB_0013e1fa;
        }
        pbVar19 = (btConvexHullShape *)
                  (*this->_vptr_btCollisionWorldImporter[0xd])
                            (implicitShapeDimensions.m_floats[1],implicitShapeDimensions.m_floats[0]
                             ,this);
      }
      break;
    case 0xd:
      fVar22 = implicitShapeDimensions.m_floats[0] + fVar1;
      iVar10 = shapeData[3].m_shapeType;
      if (iVar10 == 2) {
        pbVar19 = (btConvexHullShape *)
                  (*this->_vptr_btCollisionWorldImporter[0xc])
                            (fVar22,fVar1 + implicitShapeDimensions.m_floats[2],this);
      }
      else if (iVar10 == 1) {
        pbVar19 = (btConvexHullShape *)(*this->_vptr_btCollisionWorldImporter[0xb])(fVar22,this);
      }
      else {
        if (iVar10 != 0) {
          pcVar17 = "unknown Cylinder up axis";
          goto LAB_0013e1fa;
        }
        pbVar19 = (btConvexHullShape *)
                  (*this->_vptr_btCollisionWorldImporter[10])
                            (fVar1 + implicitShapeDimensions.m_floats[1],fVar22,this);
      }
    }
    if (pbVar19 != (btConvexHullShape *)0x0) {
LAB_0013e0c1:
      (*(pbVar19->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
        super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
        _vptr_btCollisionShape[0xb])(*(undefined4 *)&shapeData[3].m_name,pbVar19);
      this_00 = &tmpPoints;
      btVector3::deSerializeFloat((btVector3 *)this_00,(btVector3FloatData *)(shapeData + 1));
      pp_Var15 = (pbVar19->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
                 super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
                 _vptr_btCollisionShape;
      goto LAB_0013e0ea;
    }
    break;
  case 5:
  case 6:
  case 7:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
    goto switchD_0013dbb7_caseD_5;
  case 10:
    if ((ulong)(uint)shapeData[3].m_shapeType < 3) {
      iVar10 = (*this->_vptr_btCollisionWorldImporter[(ulong)(uint)shapeData[3].m_shapeType + 7])
                         (0x3f800000,0x3f800000,this);
      pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var_02,iVar10);
      if (pbVar19 != (btConvexHullShape *)0x0) {
        btCapsuleShape::deSerializeFloat((btCapsuleShape *)pbVar19,(btCapsuleShapeData *)shapeData);
        return (btCollisionShape *)pbVar19;
      }
    }
    else {
      pcVar17 = "error: wrong up axis for btCapsuleShape";
LAB_0013e1fa:
      puts(pcVar17);
    }
    break;
  case 0x15:
    iVar10 = (*this->_vptr_btCollisionWorldImporter[0x13])(this,shapeData + 1);
    iVar10 = (*this->_vptr_btCollisionWorldImporter[0x18])(this,CONCAT44(extraout_var_03,iVar10));
    plVar11 = (long *)CONCAT44(extraout_var_04,iVar10);
    iVar10 = (**(code **)(*plVar11 + 0x38))(plVar11);
    if (iVar10 != 0) {
      btVector3::deSerializeFloat
                ((btVector3 *)&tmpPoints,(btVector3FloatData *)&shapeData[1].m_shapeType);
      plVar11[1] = tmpPoints._0_8_;
      plVar11[2] = tmpPoints._8_8_;
      pcVar17 = shapeData[3].m_name;
      if (pcVar17 == (char *)0x0) {
        pbVar13 = (btOptimizedBvh *)0x0;
      }
      else {
        radii._0_4_ = SUB84(pcVar17,0);
        radii.m_size = (int)((ulong)pcVar17 >> 0x20);
        ppbVar12 = btHashMap<btHashPtr,_btOptimizedBvh_*>::find(&this->m_bvhMap,(btHashPtr *)&radii)
        ;
        if ((ppbVar12 == (btOptimizedBvh **)0x0) ||
           (pbVar13 = *ppbVar12, pbVar13 == (btOptimizedBvh *)0x0)) {
          iVar10 = (*this->_vptr_btCollisionWorldImporter[0x19])(this);
          pbVar13 = (btOptimizedBvh *)CONCAT44(extraout_var_05,iVar10);
          (*(pbVar13->super_btQuantizedBvh)._vptr_btQuantizedBvh[5])(pbVar13,shapeData[3].m_name);
        }
      }
      lVar16._0_4_ = shapeData[3].m_shapeType;
      uVar4 = shapeData[3].m_padding[0];
      uVar5 = shapeData[3].m_padding[1];
      uVar7 = shapeData[3].m_padding[2];
      uVar9 = shapeData[3].m_padding[3];
      uVar8 = CONCAT11(uVar9,uVar7);
      uVar6 = CONCAT21(uVar8,uVar5);
      lVar16._4_4_ = CONCAT31(uVar6,uVar4);
      if (lVar16 != 0) {
        radii._0_4_ = (undefined4)lVar16;
        radii.m_size = lVar16._4_4_;
        ppbVar12 = btHashMap<btHashPtr,_btOptimizedBvh_*>::find(&this->m_bvhMap,(btHashPtr *)&radii)
        ;
        if ((ppbVar12 == (btOptimizedBvh **)0x0) ||
           (pbVar13 = *ppbVar12, pbVar13 == (btOptimizedBvh *)0x0)) {
          iVar10 = (*this->_vptr_btCollisionWorldImporter[0x19])(this);
          pbVar13 = (btOptimizedBvh *)CONCAT44(extraout_var_07,iVar10);
          uVar3._0_4_ = shapeData[3].m_shapeType;
          uVar3._4_1_ = shapeData[3].m_padding[0];
          uVar3._5_1_ = shapeData[3].m_padding[1];
          uVar3._6_1_ = shapeData[3].m_padding[2];
          uVar3._7_1_ = shapeData[3].m_padding[3];
          (*(pbVar13->super_btQuantizedBvh)._vptr_btQuantizedBvh[6])(pbVar13,uVar3);
        }
      }
      iVar10 = (*this->_vptr_btCollisionWorldImporter[0x11])(this,plVar11,pbVar13);
      pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var_08,iVar10);
      (*(pbVar19->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
        super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
        _vptr_btCollisionShape[0xb])(shapeData[4].m_shapeType,pbVar19);
      if (shapeData[4].m_name == (char *)0x0) {
        return (btCollisionShape *)pbVar19;
      }
      iVar10 = (*this->_vptr_btCollisionWorldImporter[0x1a])(this);
      btTriangleInfoMap::deSerialize
                ((btTriangleInfoMap *)CONCAT44(extraout_var_09,iVar10),
                 (btTriangleInfoMapData *)shapeData[4].m_name);
      *(btTriangleInfoMap **)
       (pbVar19->super_btPolyhedralConvexAabbCachingShape).m_localAabbMin.m_floats =
           (btTriangleInfoMap *)CONCAT44(extraout_var_09,iVar10);
      return (btCollisionShape *)pbVar19;
    }
    break;
  case 0x16:
    shapeData->m_shapeType = 0x15;
    pbVar14 = convertCollisionShape(this,shapeData);
    btVector3::deSerializeFloat((btVector3 *)&tmpPoints,(btVector3FloatData *)(shapeData + 5));
    iVar10 = (*this->_vptr_btCollisionWorldImporter[0x16])(this,pbVar14,&tmpPoints);
    return (btCollisionShape *)(btConvexHullShape *)CONCAT44(extraout_var_01,iVar10);
  default:
    if (iVar10 == 0) goto switchD_0013dbb7_caseD_4;
    if (iVar10 == 0x1f) {
      iVar10 = (*this->_vptr_btCollisionWorldImporter[0x15])(this);
      radii.m_ownsMemory = true;
      radii.m_data = (float *)0x0;
      radii.m_size = 0;
      radii.m_capacity = 0;
      lVar16 = 0;
      for (lVar20 = 0; lVar20 < shapeData[1].m_shapeType; lVar20 = lVar20 + 1) {
        pbVar14 = convertCollisionShape
                            (this,*(btCollisionShapeData **)(shapeData[1].m_name + lVar16 + 0x40));
        if (pbVar14 != (btCollisionShape *)0x0) {
          btTransform::deSerializeFloat
                    ((btTransform *)&tmpPoints,
                     (btTransformFloatData *)(shapeData[1].m_name + lVar16));
          btCompoundShape::addChildShape
                    ((btCompoundShape *)CONCAT44(extraout_var_06,iVar10),(btTransform *)&tmpPoints,
                     pbVar14);
        }
        lVar16 = lVar16 + 0x50;
      }
      btAlignedObjectArray<btCollisionShape_*>::~btAlignedObjectArray
                ((btAlignedObjectArray<btCollisionShape_*> *)&radii);
      return (btCollisionShape *)(btConvexHullShape *)CONCAT44(extraout_var_06,iVar10);
    }
    if (iVar10 != 0x1c) {
      return (btCollisionShape *)(btConvexHullShape *)0x0;
    }
    btVector3::deSerializeFloat((btVector3 *)&tmpPoints,(btVector3FloatData *)(shapeData + 2));
    this_00 = (btAlignedObjectArray<btVector3> *)&radii;
    btVector3::deSerializeFloat((btVector3 *)this_00,(btVector3FloatData *)(shapeData + 1));
    iVar10 = (*this->_vptr_btCollisionWorldImporter[4])
                       (*(undefined4 *)&shapeData[3].m_name,this,&tmpPoints);
    pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var_00,iVar10);
    pp_Var15 = (pbVar19->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
               super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
               _vptr_btCollisionShape;
LAB_0013e0ea:
    (*pp_Var15[6])(pbVar19,this_00);
    goto switchD_0013dbb7_caseD_5;
  }
  pbVar19 = (btConvexHullShape *)0x0;
switchD_0013dbb7_caseD_5:
  return (btCollisionShape *)pbVar19;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::convertCollisionShape(  btCollisionShapeData* shapeData  )
{
	btCollisionShape* shape = 0;

	switch (shapeData->m_shapeType)
		{
	case STATIC_PLANE_PROXYTYPE:
		{
			btStaticPlaneShapeData* planeData = (btStaticPlaneShapeData*)shapeData;
			btVector3 planeNormal,localScaling;
			planeNormal.deSerializeFloat(planeData->m_planeNormal);
			localScaling.deSerializeFloat(planeData->m_localScaling);
			shape = createPlaneShape(planeNormal,planeData->m_planeConstant);
			shape->setLocalScaling(localScaling);

			break;
		}
	case SCALED_TRIANGLE_MESH_SHAPE_PROXYTYPE:
		{
			btScaledTriangleMeshShapeData* scaledMesh = (btScaledTriangleMeshShapeData*) shapeData;
			btCollisionShapeData* colShapeData = (btCollisionShapeData*) &scaledMesh->m_trimeshShapeData;
			colShapeData->m_shapeType = TRIANGLE_MESH_SHAPE_PROXYTYPE;
			btCollisionShape* childShape = convertCollisionShape(colShapeData);
			btBvhTriangleMeshShape* meshShape = (btBvhTriangleMeshShape*)childShape;
			btVector3 localScaling;
			localScaling.deSerializeFloat(scaledMesh->m_localScaling);

			shape = createScaledTrangleMeshShape(meshShape, localScaling);
			break;
		}
#ifdef SUPPORT_GIMPACT_SHAPE_IMPORT
	case GIMPACT_SHAPE_PROXYTYPE:
		{
			btGImpactMeshShapeData* gimpactData = (btGImpactMeshShapeData*) shapeData;
			if (gimpactData->m_gimpactSubType == CONST_GIMPACT_TRIMESH_SHAPE)
			{
				btStridingMeshInterfaceData* interfaceData = createStridingMeshInterfaceData(&gimpactData->m_meshInterface);
				btTriangleIndexVertexArray* meshInterface = createMeshInterface(*interfaceData);


				btGImpactMeshShape* gimpactShape = createGimpactShape(meshInterface);
				btVector3 localScaling;
				localScaling.deSerializeFloat(gimpactData->m_localScaling);
				gimpactShape->setLocalScaling(localScaling);
				gimpactShape->setMargin(btScalar(gimpactData->m_collisionMargin));
				gimpactShape->updateBound();
				shape = gimpactShape;
			} else
			{
				printf("unsupported gimpact sub type\n");
			}
			break;
		}
#endif //SUPPORT_GIMPACT_SHAPE_IMPORT
	//The btCapsuleShape* API has issue passing the margin/scaling/halfextents unmodified through the API
	//so deal with this
		case CAPSULE_SHAPE_PROXYTYPE:
		{
			btCapsuleShapeData* capData = (btCapsuleShapeData*)shapeData;


			switch (capData->m_upAxis)
			{
			case 0:
				{
					shape = createCapsuleShapeX(1,1);
					break;
				}
			case 1:
				{
					shape = createCapsuleShapeY(1,1);
					break;
				}
			case 2:
				{
					shape = createCapsuleShapeZ(1,1);
					break;
				}
			default:
				{
					printf("error: wrong up axis for btCapsuleShape\n");
				}


			};
			if (shape)
			{
				btCapsuleShape* cap = (btCapsuleShape*) shape;
				cap->deSerializeFloat(capData);
			}
			break;
		}
		case CYLINDER_SHAPE_PROXYTYPE:
		case CONE_SHAPE_PROXYTYPE:
		case BOX_SHAPE_PROXYTYPE:
		case SPHERE_SHAPE_PROXYTYPE:
		case MULTI_SPHERE_SHAPE_PROXYTYPE:
		case CONVEX_HULL_SHAPE_PROXYTYPE:
			{
				btConvexInternalShapeData* bsd = (btConvexInternalShapeData*)shapeData;
				btVector3 implicitShapeDimensions;
				implicitShapeDimensions.deSerializeFloat(bsd->m_implicitShapeDimensions);
				btVector3 localScaling;
				localScaling.deSerializeFloat(bsd->m_localScaling);
				btVector3 margin(bsd->m_collisionMargin,bsd->m_collisionMargin,bsd->m_collisionMargin);
				switch (shapeData->m_shapeType)
				{
					case BOX_SHAPE_PROXYTYPE:
						{
							btBoxShape* box= (btBoxShape*)createBoxShape(implicitShapeDimensions/localScaling+margin);
							//box->initializePolyhedralFeatures();
							shape = box;

							break;
						}
					case SPHERE_SHAPE_PROXYTYPE:
						{
							shape = createSphereShape(implicitShapeDimensions.getX());
							break;
						}

					case CYLINDER_SHAPE_PROXYTYPE:
						{
							btCylinderShapeData* cylData = (btCylinderShapeData*) shapeData;
							btVector3 halfExtents = implicitShapeDimensions+margin;
							switch (cylData->m_upAxis)
							{
							case 0:
								{
									shape = createCylinderShapeX(halfExtents.getY(),halfExtents.getX());
									break;
								}
							case 1:
								{
									shape = createCylinderShapeY(halfExtents.getX(),halfExtents.getY());
									break;
								}
							case 2:
								{
									shape = createCylinderShapeZ(halfExtents.getX(),halfExtents.getZ());
									break;
								}
							default:
								{
									printf("unknown Cylinder up axis\n");
								}

							};



							break;
						}
					case CONE_SHAPE_PROXYTYPE:
						{
							btConeShapeData* conData = (btConeShapeData*) shapeData;
							btVector3 halfExtents = implicitShapeDimensions;//+margin;
							switch (conData->m_upIndex)
							{
							case 0:
								{
									shape = createConeShapeX(halfExtents.getY(),halfExtents.getX());
									break;
								}
							case 1:
								{
									shape = createConeShapeY(halfExtents.getX(),halfExtents.getY());
									break;
								}
							case 2:
								{
									shape = createConeShapeZ(halfExtents.getX(),halfExtents.getZ());
									break;
								}
							default:
								{
									printf("unknown Cone up axis\n");
								}

							};



							break;
						}
					case MULTI_SPHERE_SHAPE_PROXYTYPE:
						{
							btMultiSphereShapeData* mss = (btMultiSphereShapeData*)bsd;
							int numSpheres = mss->m_localPositionArraySize;

							btAlignedObjectArray<btVector3> tmpPos;
							btAlignedObjectArray<btScalar> radii;
							radii.resize(numSpheres);
							tmpPos.resize(numSpheres);
							int i;
							for ( i=0;i<numSpheres;i++)
							{
								tmpPos[i].deSerializeFloat(mss->m_localPositionArrayPtr[i].m_pos);
								radii[i] = mss->m_localPositionArrayPtr[i].m_radius;
							}
							shape = createMultiSphereShape(&tmpPos[0],&radii[0],numSpheres);
							break;
						}
					case CONVEX_HULL_SHAPE_PROXYTYPE:
						{
						//	int sz = sizeof(btConvexHullShapeData);
						//	int sz2 = sizeof(btConvexInternalShapeData);
						//	int sz3 = sizeof(btCollisionShapeData);
							btConvexHullShapeData* convexData = (btConvexHullShapeData*)bsd;
							int numPoints = convexData->m_numUnscaledPoints;

							btAlignedObjectArray<btVector3> tmpPoints;
							tmpPoints.resize(numPoints);
							int i;
							for ( i=0;i<numPoints;i++)
							{
#ifdef BT_USE_DOUBLE_PRECISION
							if (convexData->m_unscaledPointsDoublePtr)
								tmpPoints[i].deSerialize(convexData->m_unscaledPointsDoublePtr[i]);
							if (convexData->m_unscaledPointsFloatPtr)
								tmpPoints[i].deSerializeFloat(convexData->m_unscaledPointsFloatPtr[i]);
#else
							if (convexData->m_unscaledPointsFloatPtr)
								tmpPoints[i].deSerialize(convexData->m_unscaledPointsFloatPtr[i]);
							if (convexData->m_unscaledPointsDoublePtr)
								tmpPoints[i].deSerializeDouble(convexData->m_unscaledPointsDoublePtr[i]);
#endif //BT_USE_DOUBLE_PRECISION
							}
							btConvexHullShape* hullShape = createConvexHullShape();
							for (i=0;i<numPoints;i++)
							{
								hullShape->addPoint(tmpPoints[i]);
							}
							hullShape->setMargin(bsd->m_collisionMargin);
							//hullShape->initializePolyhedralFeatures();
							shape = hullShape;
							break;
						}
					default:
						{
							printf("error: cannot create shape type (%d)\n",shapeData->m_shapeType);
						}
				}

				if (shape)
				{
					shape->setMargin(bsd->m_collisionMargin);

					btVector3 localScaling;
					localScaling.deSerializeFloat(bsd->m_localScaling);
					shape->setLocalScaling(localScaling);

				}
				break;
			}
		case TRIANGLE_MESH_SHAPE_PROXYTYPE:
		{
			btTriangleMeshShapeData* trimesh = (btTriangleMeshShapeData*)shapeData;
			btStridingMeshInterfaceData* interfaceData = createStridingMeshInterfaceData(&trimesh->m_meshInterface);
			btTriangleIndexVertexArray* meshInterface = createMeshInterface(*interfaceData);
			if (!meshInterface->getNumSubParts())
			{
				return 0;
			}

			btVector3 scaling; scaling.deSerializeFloat(trimesh->m_meshInterface.m_scaling);
			meshInterface->setScaling(scaling);


			btOptimizedBvh* bvh = 0;
#if 1
			if (trimesh->m_quantizedFloatBvh)
			{
				btOptimizedBvh** bvhPtr = m_bvhMap.find(trimesh->m_quantizedFloatBvh);
				if (bvhPtr && *bvhPtr)
				{
					bvh = *bvhPtr;
				} else
				{
					bvh = createOptimizedBvh();
					bvh->deSerializeFloat(*trimesh->m_quantizedFloatBvh);
				}
			}
			if (trimesh->m_quantizedDoubleBvh)
			{
				btOptimizedBvh** bvhPtr = m_bvhMap.find(trimesh->m_quantizedDoubleBvh);
				if (bvhPtr && *bvhPtr)
				{
					bvh = *bvhPtr;
				} else
				{
					bvh = createOptimizedBvh();
					bvh->deSerializeDouble(*trimesh->m_quantizedDoubleBvh);
				}
			}
#endif


			btBvhTriangleMeshShape* trimeshShape = createBvhTriangleMeshShape(meshInterface,bvh);
			trimeshShape->setMargin(trimesh->m_collisionMargin);
			shape = trimeshShape;

			if (trimesh->m_triangleInfoMap)
			{
				btTriangleInfoMap* map = createTriangleInfoMap();
				map->deSerialize(*trimesh->m_triangleInfoMap);
				trimeshShape->setTriangleInfoMap(map);

#ifdef USE_INTERNAL_EDGE_UTILITY
				gContactAddedCallback = btAdjustInternalEdgeContactsCallback;
#endif //USE_INTERNAL_EDGE_UTILITY

			}

			//printf("trimesh->m_collisionMargin=%f\n",trimesh->m_collisionMargin);
			break;
		}
		case COMPOUND_SHAPE_PROXYTYPE:
			{
				btCompoundShapeData* compoundData = (btCompoundShapeData*)shapeData;
				btCompoundShape* compoundShape = createCompoundShape();

				btCompoundShapeChildData* childShapeDataArray = &compoundData->m_childShapePtr[0];


				btAlignedObjectArray<btCollisionShape*> childShapes;
				for (int i=0;i<compoundData->m_numChildShapes;i++)
				{
					btCompoundShapeChildData* ptr = &compoundData->m_childShapePtr[i];

					btCollisionShapeData* cd = compoundData->m_childShapePtr[i].m_childShape;

					btCollisionShape* childShape = convertCollisionShape(cd);
					if (childShape)
					{
						btTransform localTransform;
						localTransform.deSerializeFloat(compoundData->m_childShapePtr[i].m_transform);
						compoundShape->addChildShape(localTransform,childShape);
					} else
					{
#ifdef _DEBUG
						printf("error: couldn't create childShape for compoundShape\n");
#endif
					}

				}
				shape = compoundShape;

				break;
			}
		case SOFTBODY_SHAPE_PROXYTYPE:
			{
				return 0;
			}
		default:
			{
#ifdef _DEBUG
				printf("unsupported shape type (%d)\n",shapeData->m_shapeType);
#endif
			}
		}

		return shape;

}